

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O1

int sp_coletree(int_t *acolst,int_t *acolend,int_t *arow,int nr,int nc,int *parent)

{
  ulong uVar1;
  int *addr;
  int *addr_00;
  int *addr_01;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  addr = mxCallocInt(nc);
  addr_00 = mxCallocInt(nc);
  addr_01 = mxCallocInt(nr);
  if (0 < nr) {
    uVar3 = 0;
    do {
      addr_01[uVar3] = nc;
      uVar3 = uVar3 + 1;
    } while ((uint)nr != uVar3);
  }
  if (0 < nc) {
    uVar3 = 0;
    do {
      lVar4 = (long)acolst[uVar3];
      if (acolst[uVar3] < acolend[uVar3]) {
        do {
          iVar2 = addr_01[arow[lVar4]];
          if ((int)uVar3 <= addr_01[arow[lVar4]]) {
            iVar2 = (int)uVar3;
          }
          addr_01[arow[lVar4]] = iVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 < acolend[uVar3]);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)nc);
  }
  if (0 < nc) {
    uVar3 = 0;
    do {
      iVar2 = (int)uVar3;
      addr_00[uVar3] = iVar2;
      addr[uVar3] = iVar2;
      parent[uVar3] = nc;
      lVar4 = (long)acolst[uVar3];
      uVar1 = uVar3;
      if (acolst[uVar3] < acolend[uVar3]) {
        do {
          uVar5 = uVar1 & 0xffffffff;
          lVar8 = (long)addr_01[arow[lVar4]];
          if (lVar8 < (long)uVar3) {
            uVar7 = (ulong)addr_00[lVar8];
            iVar6 = addr_00[uVar7];
            if (iVar6 != addr_00[lVar8]) {
              do {
                addr_00[lVar8] = iVar6;
                lVar8 = (long)iVar6;
                uVar7 = (ulong)addr_00[lVar8];
                iVar6 = addr_00[uVar7];
              } while (iVar6 != addr_00[lVar8]);
            }
            iVar6 = (int)uVar7;
            if (uVar3 != (uint)addr[iVar6]) {
              parent[addr[iVar6]] = iVar2;
              addr_00[(int)uVar1] = iVar6;
              addr[iVar6] = iVar2;
              uVar5 = uVar7;
            }
          }
          lVar4 = lVar4 + 1;
          uVar1 = uVar5;
        } while (lVar4 < acolend[uVar3]);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)nc);
  }
  superlu_free(addr);
  superlu_free(addr_01);
  superlu_free(addr_00);
  return 0;
}

Assistant:

int sp_coletree(
                const int_t *acolst, const int_t *acolend, /* column start and end past 1 */
                const int_t *arow,                 /* row indices of A */
                int nr, int nc,            /* dimension of A */
                int *parent)               /* parent in elim tree */
{
	int	*root;			/* root of subtree of etree 	*/
	int     *firstcol;		/* first nonzero col in each row*/
	int	rset, cset;             
	int	row, col;
	int	rroot;
	int	p;
	int     *pp;

	root = mxCallocInt (nc);
	initialize_disjoint_sets (nc, &pp);

	/* Compute firstcol[row] = first nonzero column in row */

	firstcol = mxCallocInt (nr);
	for (row = 0; row < nr; firstcol[row++] = nc);
	for (col = 0; col < nc; col++) 
		for (p = acolst[col]; p < acolend[col]; p++) {
			row = arow[p];
			firstcol[row] = SUPERLU_MIN(firstcol[row], col);
		}

	/* Compute etree by Liu's algorithm for symmetric matrices,
           except use (firstcol[r],c) in place of an edge (r,c) of A.
	   Thus each row clique in A'*A is replaced by a star
	   centered at its first vertex, which has the same fill. */

	for (col = 0; col < nc; col++) {
		cset = make_set (col, pp);
		root[cset] = col;
		parent[col] = nc; /* Matlab */
		for (p = acolst[col]; p < acolend[col]; p++) {
			row = firstcol[arow[p]];
			if (row >= col) continue;
			rset = find (row, pp);
			rroot = root[rset];
			if (rroot != col) {
				parent[rroot] = col;
				cset = link (cset, rset, pp);
				root[cset] = col;
			}
		}
	}

	SUPERLU_FREE (root);
	SUPERLU_FREE (firstcol);
	finalize_disjoint_sets (pp);
	return 0;
}